

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeParser.hpp
# Opt level: O2

SymbolType __thiscall
Storage::Tape::Parser<Storage::Tape::Commodore::SymbolType>::get_next_symbol
          (Parser<Storage::Tape::Commodore::SymbolType> *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  byte bVar1;
  int iVar2;
  Pulse local_28;
  
  do {
    bVar1 = this->has_next_symbol_;
    if ((bool)bVar1 != false) {
LAB_003ef7a7:
      if ((bVar1 & 1) == 0) {
        iVar2 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->_vptr_Tape)();
        if ((char)iVar2 != '\0') {
          (*this->_vptr_Parser[1])(this);
        }
      }
      this->has_next_symbol_ = false;
      return this->next_symbol_;
    }
    iVar2 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->_vptr_Tape)();
    if ((char)iVar2 != '\0') {
      bVar1 = this->has_next_symbol_;
      goto LAB_003ef7a7;
    }
    local_28 = Tape::get_next_pulse
                         ((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr);
    (**this->_vptr_Parser)(this,&local_28);
  } while( true );
}

Assistant:

SymbolType get_next_symbol(const std::shared_ptr<Storage::Tape::Tape> &tape) {
			while(!has_next_symbol_ && !tape->is_at_end()) {
				process_pulse(tape->get_next_pulse());
			}
			if(!has_next_symbol_ && tape->is_at_end()) mark_end();
			has_next_symbol_ = false;
			return next_symbol_;
		}